

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O1

double __thiscall
GammaHandler::photoIonization
          (GammaHandler *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *sourceInfo,vector<double,_std::allocator<double>_> *xyTry)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  pointer pvVar6;
  double dVar7;
  
  pvVar1 = (sourceInfo->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(sourceInfo->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar4 == 0) {
    bVar3 = false;
    lVar4 = 0;
  }
  else {
    lVar2 = (lVar4 >> 3) * -0x5555555555555555;
    lVar5 = 0;
    lVar4 = 0;
    bVar3 = false;
    pvVar6 = pvVar1;
    do {
      if (ABS(*(xyTry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start -
              *(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start) < brThresh) {
        bVar3 = true;
        lVar4 = lVar5;
      }
      lVar5 = lVar5 + 1;
      pvVar6 = pvVar6 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar5);
  }
  dVar7 = 0.0;
  if (bVar3) {
    lVar4 = *(long *)&pvVar1[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl;
    dVar7 = (*(double *)(lVar4 + 0x10) /
            (*(double *)(lVar4 + 0x18) + *(double *)(lVar4 + 0x10) + *(double *)(lVar4 + 0x20))) *
            *(double *)(lVar4 + 8) * yMax;
  }
  return dVar7;
}

Assistant:

double GammaHandler::photoIonization(const vector<vector<double>>& sourceInfo,
                                     const vector<double>& xyTry) {
  // implement simple delta function to the spectrum
  std::size_t index{0};
  bool found = false;
  for (int i = 0; i < sourceInfo.size(); i++) {
    double initialEnergy = sourceInfo[i][0];
    if (abs(xyTry[0] - initialEnergy) < brThresh) {
      index = i;
      found = true;
    }
  }
  double br = sourceInfo[index][1];
  double pe = sourceInfo[index][2];
  double co = sourceInfo[index][3];
  double pp = sourceInfo[index][4];
  if (found) return yMax * br * (pe / (pe + co + pp));
  return 0.0;
}